

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnLocalDecl(SharedValidator *this,Location *loc,Index count,Type type)

{
  Index IVar1;
  value_type local_40;
  Enum local_34;
  undefined4 local_30;
  Index local_2c;
  uint max_locals;
  Index count_local;
  Location *loc_local;
  SharedValidator *this_local;
  Type type_local;
  
  local_30 = 0xffffffff;
  local_2c = count;
  _max_locals = loc;
  loc_local = (Location *)this;
  unique0x100000c2 = type;
  IVar1 = GetLocalCount(this);
  if (-IVar1 - 1 < count) {
    local_34 = (Enum)PrintError(this,_max_locals,"local count must be < 0x10000000");
    Result::Result((Result *)&type_local,Error);
  }
  else {
    local_40.type = stack0xffffffffffffffec;
    local_40.end = GetLocalCount(this);
    local_40.end = local_40.end + local_2c;
    std::vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>
    ::push_back(&this->locals_,&local_40);
    Result::Result((Result *)&type_local,Ok);
  }
  return (Result)type_local.enum_;
}

Assistant:

Result SharedValidator::OnLocalDecl(const Location& loc,
                                    Index count,
                                    Type type) {
  const auto max_locals = std::numeric_limits<Index>::max();
  if (count > max_locals - GetLocalCount()) {
    PrintError(loc, "local count must be < 0x10000000");
    return Result::Error;
  }
  locals_.push_back(LocalDecl{type, GetLocalCount() + count});
  return Result::Ok;
}